

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void tinyxml2::XMLUtil::ConvertUTF32ToUTF8(unsigned_long input,char *output,int *length)

{
  int *in_RDX;
  long in_RSI;
  ulong in_RDI;
  unsigned_long FIRST_BYTE_MARK [7];
  unsigned_long BYTE_MARK;
  unsigned_long BYTE_MASK;
  undefined8 local_68 [8];
  undefined8 local_28;
  undefined8 local_20;
  int *local_18;
  byte *local_10;
  ulong local_8;
  
  local_20 = 0xbf;
  local_28 = 0x80;
  local_18 = in_RDX;
  local_10 = (byte *)in_RSI;
  local_8 = in_RDI;
  memset(local_68,0,0x38);
  local_68[2] = 0xc0;
  local_68[3] = 0xe0;
  local_68[4] = 0xf0;
  local_68[5] = 0xf8;
  local_68[6] = 0xfc;
  if (local_8 < 0x80) {
    *local_18 = 1;
  }
  else if (local_8 < 0x800) {
    *local_18 = 2;
  }
  else if (local_8 < 0x10000) {
    *local_18 = 3;
  }
  else {
    if (0x1fffff < local_8) {
      *local_18 = 0;
      return;
    }
    *local_18 = 4;
  }
  local_10 = (byte *)((long)local_10 + (long)*local_18);
  switch(*local_18) {
  case 4:
    local_10 = local_10 + -1;
    *local_10 = (byte)local_8 & 0xbf | 0x80;
    local_8 = local_8 >> 6;
  case 3:
    local_10 = local_10 + -1;
    *local_10 = (byte)local_8 & 0xbf | 0x80;
    local_8 = local_8 >> 6;
  case 2:
    local_10 = local_10 + -1;
    *local_10 = (byte)local_8 & 0xbf | 0x80;
    local_8 = local_8 >> 6;
  case 1:
    local_10 = local_10 + -1;
    *local_10 = (byte)local_8 | (byte)local_68[*local_18];
    return;
  default:
    return;
  }
}

Assistant:

void XMLUtil::ConvertUTF32ToUTF8( unsigned long input, char* output, int* length )
{
    const unsigned long BYTE_MASK = 0xBF;
    const unsigned long BYTE_MARK = 0x80;
    const unsigned long FIRST_BYTE_MARK[7] = { 0x00, 0x00, 0xC0, 0xE0, 0xF0, 0xF8, 0xFC };

    if (input < 0x80) {
        *length = 1;
    }
    else if ( input < 0x800 ) {
        *length = 2;
    }
    else if ( input < 0x10000 ) {
        *length = 3;
    }
    else if ( input < 0x200000 ) {
        *length = 4;
    }
    else {
        *length = 0;    // This code won't convert this correctly anyway.
        return;
    }

    output += *length;

    // Scary scary fall throughs.
    switch (*length) {
        case 4:
            --output;
            *output = (char)((input | BYTE_MARK) & BYTE_MASK);
            input >>= 6;
        case 3:
            --output;
            *output = (char)((input | BYTE_MARK) & BYTE_MASK);
            input >>= 6;
        case 2:
            --output;
            *output = (char)((input | BYTE_MARK) & BYTE_MASK);
            input >>= 6;
        case 1:
            --output;
            *output = (char)(input | FIRST_BYTE_MARK[*length]);
            break;
        default:
            TIXMLASSERT( false );
    }
}